

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

int32_t __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeHoleAndTopologySplitEvents
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          DecoderBuffer *decoder_buffer)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  CornerTable *pCVar5;
  pointer pTVar6;
  bool bVar7;
  uint32_t i_3;
  uint32_t i_2;
  ulong uVar8;
  uint32_t i_1;
  uint uVar9;
  long lVar10;
  uint32_t i;
  uint uVar11;
  uint8_t edge_data;
  uint32_t num_topology_splits;
  uint32_t num_hole_events;
  uint local_44;
  byte local_40;
  uint32_t delta_1;
  vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_> *local_38;
  
  if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    bVar7 = DecoderBuffer::Decode<unsigned_int>(decoder_buffer,&num_topology_splits);
  }
  else {
    bVar7 = DecodeVarint<unsigned_int>(&num_topology_splits,decoder_buffer);
  }
  if (bVar7 == false) {
    return -1;
  }
  if (num_topology_splits != 0) {
    pCVar5 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    if ((uint)((ulong)((long)*(pointer *)((long)&(pCVar5->corner_to_vertex_map_).vector_ + 8) -
                       *(long *)&(pCVar5->corner_to_vertex_map_).vector_ >> 2) / 3) <
        num_topology_splits) {
      return -1;
    }
    uVar2._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar2._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    if ((ushort)(uVar2 << 8 | uVar2 >> 8) < 0x102) {
      for (uVar11 = 0; uVar11 < num_topology_splits; uVar11 = uVar11 + 1) {
        bVar7 = DecoderBuffer::Decode<unsigned_int>(decoder_buffer,(uint *)&num_hole_events);
        if (!bVar7) {
          return -1;
        }
        bVar7 = DecoderBuffer::Decode<unsigned_int>(decoder_buffer,&local_44);
        if (!bVar7) {
          return -1;
        }
        bVar7 = DecoderBuffer::Decode<unsigned_char>(decoder_buffer,&edge_data);
        if (!bVar7) {
          return -1;
        }
        local_40 = local_40 & 0xfe | edge_data & 1;
        std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
        push_back(&this->topology_split_data_,(value_type *)&num_hole_events);
      }
    }
    else {
      local_38 = &this->topology_split_data_;
      uVar11 = 0;
      for (uVar9 = 0; uVar9 < num_topology_splits; uVar9 = uVar9 + 1) {
        bVar7 = DecodeVarint<unsigned_int>((uint *)&edge_data,decoder_buffer);
        if (!bVar7) {
          return -1;
        }
        local_44 = uVar11 + _edge_data;
        bVar7 = DecodeVarint<unsigned_int>((uint *)&edge_data,decoder_buffer);
        uVar11 = local_44;
        if (!bVar7) {
          return -1;
        }
        num_hole_events = local_44 - _edge_data;
        if (local_44 < (uint)_edge_data) {
          return -1;
        }
        std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
        push_back(local_38,(value_type *)&num_hole_events);
      }
      DecoderBuffer::StartBitDecoding(decoder_buffer,false,(uint64_t *)0x0);
      lVar10 = 8;
      for (uVar8 = 0; uVar8 < num_topology_splits; uVar8 = uVar8 + 1) {
        uVar3._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
        uVar3._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
        DecoderBuffer::DecodeLeastSignificantBits32
                  (decoder_buffer,((ushort)(uVar3 << 8 | uVar3 >> 8) < 0x202) + 1,&num_hole_events);
        pTVar6 = (this->topology_split_data_).
                 super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(byte *)((long)&pTVar6->split_symbol_id + lVar10) =
             *(byte *)((long)&pTVar6->split_symbol_id + lVar10) & 0xfe | (byte)num_hole_events & 1;
        lVar10 = lVar10 + 0xc;
      }
      DecoderBuffer::EndBitDecoding(decoder_buffer);
    }
  }
  num_hole_events = 0;
  bVar1 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  if (bVar1 < 2) {
    bVar7 = DecoderBuffer::Decode<unsigned_int>(decoder_buffer,&num_hole_events);
  }
  else {
    if (0x200 < CONCAT11(bVar1,(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                               version_minor_)) goto LAB_00127510;
    bVar7 = DecodeVarint<unsigned_int>(&num_hole_events,decoder_buffer);
  }
  if (bVar7 == false) {
    return -1;
  }
LAB_00127510:
  if (num_hole_events != 0) {
    uVar4._0_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar4._1_1_ = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    uVar11 = 0;
    if ((ushort)(uVar4 << 8 | uVar4 >> 8) < 0x102) {
      for (; uVar11 < num_hole_events; uVar11 = uVar11 + 1) {
        _edge_data = 0;
        bVar7 = DecoderBuffer::Decode<draco::HoleEventData>
                          (decoder_buffer,(HoleEventData *)&edge_data);
        if (!bVar7) {
          return -1;
        }
        std::vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>::push_back
                  (&this->hole_event_data_,(HoleEventData *)&edge_data);
      }
    }
    else {
      for (uVar9 = 0; uVar9 < num_hole_events; uVar9 = uVar9 + 1) {
        _edge_data = 0;
        bVar7 = DecodeVarint<unsigned_int>(&delta_1,decoder_buffer);
        if (!bVar7) {
          return -1;
        }
        uVar11 = uVar11 + delta_1;
        _edge_data = uVar11;
        std::vector<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>::push_back
                  (&this->hole_event_data_,(value_type *)&edge_data);
      }
    }
  }
  return (int32_t)decoder_buffer->pos_;
}

Assistant:

int32_t
MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeHoleAndTopologySplitEvents(
    DecoderBuffer *decoder_buffer) {
  // Prepare a new decoder from the provided buffer offset.
  uint32_t num_topology_splits;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_topology_splits)) {
      return -1;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_topology_splits, decoder_buffer)) {
      return -1;
    }
  }
  if (num_topology_splits > 0) {
    if (num_topology_splits >
        static_cast<uint32_t>(corner_table_->num_faces())) {
      return -1;
    }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        if (!decoder_buffer->Decode(&event_data.split_symbol_id)) {
          return -1;
        }
        if (!decoder_buffer->Decode(&event_data.source_symbol_id)) {
          return -1;
        }
        uint8_t edge_data;
        if (!decoder_buffer->Decode(&edge_data)) {
          return -1;
        }
        event_data.source_edge = edge_data & 1;
        topology_split_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode source and split symbol ids using delta and varint coding. See
      // description in mesh_edgebreaker_encoder_impl.cc for more details.
      int last_source_symbol_id = 0;
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        TopologySplitEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.source_symbol_id = delta + last_source_symbol_id;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        if (delta > event_data.source_symbol_id) {
          return -1;
        }
        event_data.split_symbol_id =
            event_data.source_symbol_id - static_cast<int32_t>(delta);
        last_source_symbol_id = event_data.source_symbol_id;
        topology_split_data_.push_back(event_data);
      }
      // Split edges are decoded from a direct bit decoder.
      decoder_buffer->StartBitDecoding(false, nullptr);
      for (uint32_t i = 0; i < num_topology_splits; ++i) {
        uint32_t edge_data;
        if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
          decoder_buffer->DecodeLeastSignificantBits32(2, &edge_data);
        } else {
          decoder_buffer->DecodeLeastSignificantBits32(1, &edge_data);
        }
        TopologySplitEventData &event_data = topology_split_data_[i];
        event_data.source_edge = edge_data & 1;
      }
      decoder_buffer->EndBitDecoding();
    }
  }
  uint32_t num_hole_events = 0;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_buffer->Decode(&num_hole_events)) {
      return -1;
    }
  } else if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
    if (!DecodeVarint(&num_hole_events, decoder_buffer)) {
      return -1;
    }
  }
#endif
  if (num_hole_events > 0) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(1, 2)) {
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        if (!decoder_buffer->Decode(&event_data)) {
          return -1;
        }
        hole_event_data_.push_back(event_data);
      }

    } else
#endif
    {
      // Decode hole symbol ids using delta and varint coding.
      int last_symbol_id = 0;
      for (uint32_t i = 0; i < num_hole_events; ++i) {
        HoleEventData event_data;
        uint32_t delta;
        if (!DecodeVarint<uint32_t>(&delta, decoder_buffer)) {
          return -1;
        }
        event_data.symbol_id = delta + last_symbol_id;
        last_symbol_id = event_data.symbol_id;
        hole_event_data_.push_back(event_data);
      }
    }
  }
  return static_cast<int32_t>(decoder_buffer->decoded_size());
}